

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O3

UBool ucnv_outputOverflowFromUnicode
                (UConverter *cnv,char **target,char *targetLimit,int32_t **pOffsets,UErrorCode *err)

{
  int32_t *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint8_t *puVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  
  if (pOffsets == (int32_t **)0x0) {
    piVar1 = (int32_t *)0x0;
  }
  else {
    piVar1 = *pOffsets;
  }
  puVar5 = (uint8_t *)*target;
  uVar6 = (ulong)cnv->charErrorBufferLength;
  if (0 < (long)uVar6) {
    lVar4 = -1;
    puVar7 = cnv->charErrorBuffer;
    do {
      if (puVar5 == (uint8_t *)targetLimit) {
        lVar2 = 0;
        do {
          lVar3 = lVar2 + 1;
          cnv->charErrorBuffer[lVar2] = puVar7[lVar2];
          uVar8 = lVar2 - lVar4;
          lVar2 = lVar3;
        } while (uVar8 < uVar6);
        cnv->charErrorBufferLength = (int8_t)lVar3;
        *target = (char *)puVar5;
        if (piVar1 != (int32_t *)0x0) {
          *pOffsets = piVar1;
        }
        *err = U_BUFFER_OVERFLOW_ERROR;
        return '\x01';
      }
      *puVar5 = *puVar7;
      if (piVar1 == (int32_t *)0x0) {
        piVar1 = (int32_t *)0x0;
      }
      else {
        *piVar1 = -1;
        piVar1 = piVar1 + 1;
      }
      puVar5 = puVar5 + 1;
      puVar7 = puVar7 + 1;
      lVar2 = uVar6 + lVar4;
      lVar4 = lVar4 + -1;
    } while (lVar2 != 0);
  }
  cnv->charErrorBufferLength = '\0';
  *target = (char *)puVar5;
  if (piVar1 != (int32_t *)0x0) {
    *pOffsets = piVar1;
  }
  return '\0';
}

Assistant:

static UBool
ucnv_outputOverflowFromUnicode(UConverter *cnv,
                               char **target, const char *targetLimit,
                               int32_t **pOffsets,
                               UErrorCode *err) {
    int32_t *offsets;
    char *overflow, *t;
    int32_t i, length;

    t=*target;
    if(pOffsets!=NULL) {
        offsets=*pOffsets;
    } else {
        offsets=NULL;
    }

    overflow=(char *)cnv->charErrorBuffer;
    length=cnv->charErrorBufferLength;
    i=0;
    while(i<length) {
        if(t==targetLimit) {
            /* the overflow buffer contains too much, keep the rest */
            int32_t j=0;

            do {
                overflow[j++]=overflow[i++];
            } while(i<length);

            cnv->charErrorBufferLength=(int8_t)j;
            *target=t;
            if(offsets!=NULL) {
                *pOffsets=offsets;
            }
            *err=U_BUFFER_OVERFLOW_ERROR;
            return TRUE;
        }

        /* copy the overflow contents to the target */
        *t++=overflow[i++];
        if(offsets!=NULL) {
            *offsets++=-1; /* no source index available for old output */
        }
    }

    /* the overflow buffer is completely copied to the target */
    cnv->charErrorBufferLength=0;
    *target=t;
    if(offsets!=NULL) {
        *pOffsets=offsets;
    }
    return FALSE;
}